

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_util.cpp
# Opt level: O2

void duckdb::regexp_util::ParseRegexOptions
               (ClientContext *context,Expression *expr,Options *target,bool *global_replace)

{
  int iVar1;
  string *options;
  ParameterNotResolvedException *this;
  InvalidInputException *pIVar2;
  allocator local_91;
  string local_90;
  Value options_str;
  
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[6])(expr);
  if ((char)iVar1 != '\0') {
    this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this);
    __cxa_throw(this,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar1 == '\0') {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&options_str,"Regex options field must be a constant",
               (allocator *)&local_90);
    InvalidInputException::InvalidInputException(pIVar2,(string *)&options_str);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ExpressionExecutor::EvaluateScalar(&options_str,context,expr,false);
  if (options_str.is_null == true) {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_90,"Regex options field must not be NULL",&local_91);
    InvalidInputException::InvalidInputException(pIVar2,&local_90);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (options_str.type_.id_ == VARCHAR) {
    options = StringValue::Get_abi_cxx11_(&options_str);
    ParseRegexOptions(options,target,global_replace);
    Value::~Value(&options_str);
    return;
  }
  pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_90,"Regex options field must be a string",&local_91);
  InvalidInputException::InvalidInputException(pIVar2,&local_90);
  __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParseRegexOptions(ClientContext &context, Expression &expr, RE2::Options &target, bool *global_replace) {
	if (expr.HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Regex options field must be a constant");
	}
	Value options_str = ExpressionExecutor::EvaluateScalar(context, expr);
	if (options_str.IsNull()) {
		throw InvalidInputException("Regex options field must not be NULL");
	}
	if (options_str.type().id() != LogicalTypeId::VARCHAR) {
		throw InvalidInputException("Regex options field must be a string");
	}
	ParseRegexOptions(StringValue::Get(options_str), target, global_replace);
}